

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjDumpParser.cpp
# Opt level: O2

bool __thiscall ObjDumpParser::parseFunctionCall(ObjDumpParser *this,char **data,size_t size)

{
  char *pcVar1;
  bool bVar2;
  
  pcVar1 = *data;
  bVar2 = expectAddress(data);
  if (((bVar2) && (bVar2 = expectString<3ul>(data,(char (*) [3])":\t"), bVar2)) &&
     (bVar2 = expectAsmBytes(data), bVar2)) {
    bVar2 = expectString<8ul>(data,(char (*) [8])"callq  ");
    if ((!bVar2) && (bVar2 = expectString<7ul>(data,(char (*) [7])"call  "), !bVar2)) {
      return false;
    }
    bVar2 = expectAddress(data);
    if (((bVar2) && (bVar2 = expectString<3ul>(data,(char (*) [3])" <"), bVar2)) &&
       (pcVar1[size - 1] == '>')) {
      bVar2 = ScParser::parseFunctionCall(this->m_scParser,data);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool ObjDumpParser::parseFunctionCall(char *&data, std::size_t size)
{
    const char *const endOfData = data + size - 1;

    if (!(expectAddress(data) && expectString(data, ":\t") && expectAsmBytes(data)
          && (expectString(data, "callq  ") || expectString(data, "call  ")) && expectAddress(data)
          && expectString(data, " <"))) {
        return false;
    }

    if (!eqString(endOfData, ">")) {
        return false;
    }

    return m_scParser.parseFunctionCall(data);
}